

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O1

void __thiscall
QOpenGLTextureHelper::qt_TextureImage2D
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLint level,
          GLenum internalFormat,GLsizei width,GLsizei height,GLint border,GLenum format,GLenum type,
          GLvoid *pixels)

{
  QOpenGLFunctions *pQVar1;
  GLenum GVar2;
  GLenum GVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_3c = 0xaaaaaaaa;
  bVar4 = 5 < target - 0x8515;
  GVar3 = 0x8514;
  if (bVar4) {
    GVar3 = bindingTarget;
  }
  pQVar1 = this->functions;
  GVar2 = 0x8513;
  if (bVar4) {
    GVar2 = target;
  }
  (**(code **)(*(long *)pQVar1 + 200))(GVar3,&uStack_3c);
  (*(code *)**(undefined8 **)pQVar1)(GVar2,texture);
  (**(code **)(*(long *)this->functions + 0x140))
            (target,level,internalFormat,width,height,border,format,type,pixels);
  (*(code *)**(undefined8 **)pQVar1)(GVar2,uStack_3c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureImage2D(GLuint texture, GLenum target, GLenum bindingTarget, GLint level, GLenum internalFormat, GLsizei width, GLsizei height, GLint border, GLenum format, GLenum type, const GLvoid *pixels)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    functions->glTexImage2D(target, level, internalFormat, width, height, border, format, type, pixels);
}